

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O3

TestLog * glu::operator<<(TestLog *log,ShaderProgram *shaderProgram)

{
  TestLog *pTVar1;
  pointer ppSVar2;
  ShaderInfo **shaderInfos;
  long lVar3;
  int shaderType;
  long lVar4;
  vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> shaderPtrs;
  ShaderInfo **local_58;
  long lStack_50;
  long local_48;
  TestLog *local_40;
  ShaderInfo *local_38;
  
  local_58 = (ShaderInfo **)0x0;
  lStack_50 = 0;
  local_48 = 0;
  lVar4 = 0;
  local_40 = log;
  do {
    ppSVar2 = shaderProgram->m_shaders[lVar4].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)shaderProgram->m_shaders[lVar4].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2) >> 3)) {
      lVar3 = 0;
      do {
        local_38 = &ppSVar2[lVar3]->m_info;
        std::vector<glu::ShaderInfo_const*,std::allocator<glu::ShaderInfo_const*>>::
        emplace_back<glu::ShaderInfo_const*>
                  ((vector<glu::ShaderInfo_const*,std::allocator<glu::ShaderInfo_const*>> *)
                   &local_58,&local_38);
        lVar3 = lVar3 + 1;
        ppSVar2 = shaderProgram->m_shaders[lVar4].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (lVar3 < (int)((ulong)((long)shaderProgram->m_shaders[lVar4].
                                           super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppSVar2) >> 3));
    }
    pTVar1 = local_40;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  shaderInfos = (ShaderInfo **)0x0;
  if (lStack_50 - (long)local_58 != 0) {
    shaderInfos = local_58;
  }
  logShaderProgram(local_40,&(shaderProgram->m_program).m_info,lStack_50 - (long)local_58 >> 3,
                   shaderInfos);
  if (local_58 != (ShaderInfo **)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  return pTVar1;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const ShaderProgram& shaderProgram)
{
	std::vector<const ShaderInfo*>	shaderPtrs;

	for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
	{
		for (int shaderNdx = 0; shaderNdx < shaderProgram.getNumShaders((ShaderType)shaderType); shaderNdx++)
			shaderPtrs.push_back(&shaderProgram.getShaderInfo((ShaderType)shaderType, shaderNdx));
	}

	logShaderProgram(log, shaderProgram.getProgramInfo(), shaderPtrs.size(), shaderPtrs.empty() ? DE_NULL : &shaderPtrs[0]);

	return log;
}